

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraCodeBlocksGenerator::CreateDummyTargetFile_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmLocalGenerator *lg,
          cmGeneratorTarget *target)

{
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  undefined1 local_2a8 [8];
  cmGeneratedFileStream fout;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *lg_local;
  cmExtraCodeBlocksGenerator *this_local;
  string *filename;
  
  psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(lg);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  (*lg->_vptr_cmLocalGenerator[0xc])(&fout.field_0x240,lg,target);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&fout.field_0x240);
  std::__cxx11::string::~string((string *)&fout.field_0x240);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar2);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".objlib");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2a8,__return_storage_ptr__,false,None);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)(local_2a8 + (long)*(_func_int **)((long)local_2a8 + -0x18)));
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)local_2a8,"# This is a dummy file for the OBJECT library ");
    psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar3 = std::operator<<(poVar3,(string *)psVar2);
    poVar3 = std::operator<<(poVar3," for the CMake CodeBlocks project generator.\n");
    std::operator<<(poVar3,"# Don\'t edit, this file will be overwritten.\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2a8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::CreateDummyTargetFile(
  cmLocalGenerator* lg, cmGeneratorTarget* target) const
{
  // this file doesn't seem to be used by C::B in custom makefile mode,
  // but we generate a unique file for each OBJECT library so in case
  // C::B uses it in some way, the targets don't interfere with each other.
  std::string filename = lg->GetCurrentBinaryDirectory();
  filename += "/";
  filename += lg->GetTargetDirectory(target);
  filename += "/";
  filename += target->GetName();
  filename += ".objlib";
  cmGeneratedFileStream fout(filename);
  if (fout) {
    /* clang-format off */
    fout << "# This is a dummy file for the OBJECT library "
         << target->GetName()
         << " for the CMake CodeBlocks project generator.\n"
         << "# Don't edit, this file will be overwritten.\n";
    /* clang-format on */
  }
  return filename;
}